

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void PerlinNoiseTest<Blob<128>>
               (int Xbits,int Ybits,int inputLen,int step,pfHash hash,
               vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  uint uVar1;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  int y;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint local_154;
  size_t local_150;
  Blob<128> h;
  char key [256];
  
  uVar2 = 1 << (Xbits & 0x1fU);
  uVar4 = 1 << (Ybits & 0x1fU);
  key[0xc0] = '\0';
  key[0xc1] = '\0';
  key[0xc2] = '\0';
  key[0xc3] = '\0';
  key[0xc4] = '\0';
  key[0xc5] = '\0';
  key[0xc6] = '\0';
  key[199] = '\0';
  key[200] = '\0';
  key[0xc9] = '\0';
  key[0xca] = '\0';
  key[0xcb] = '\0';
  key[0xcc] = '\0';
  key[0xcd] = '\0';
  key[0xce] = '\0';
  key[0xcf] = '\0';
  key[0xd0] = '\0';
  key[0xd1] = '\0';
  key[0xd2] = '\0';
  key[0xd3] = '\0';
  key[0xd4] = '\0';
  key[0xd5] = '\0';
  key[0xd6] = '\0';
  key[0xd7] = '\0';
  key[0xd8] = '\0';
  key[0xd9] = '\0';
  key[0xda] = '\0';
  key[0xdb] = '\0';
  key[0xdc] = '\0';
  key[0xdd] = '\0';
  key[0xde] = '\0';
  key[0xdf] = '\0';
  key[0xe0] = '\0';
  key[0xe1] = '\0';
  key[0xe2] = '\0';
  key[0xe3] = '\0';
  key[0xe4] = '\0';
  key[0xe5] = '\0';
  key[0xe6] = '\0';
  key[0xe7] = '\0';
  key[0xe8] = '\0';
  key[0xe9] = '\0';
  key[0xea] = '\0';
  key[0xeb] = '\0';
  key[0xec] = '\0';
  key[0xed] = '\0';
  key[0xee] = '\0';
  key[0xef] = '\0';
  key[0xf0] = '\0';
  key[0xf1] = '\0';
  key[0xf2] = '\0';
  key[0xf3] = '\0';
  key[0xf4] = '\0';
  key[0xf5] = '\0';
  key[0xf6] = '\0';
  key[0xf7] = '\0';
  key[0xf8] = '\0';
  key[0xf9] = '\0';
  key[0xfa] = '\0';
  key[0xfb] = '\0';
  key[0xfc] = '\0';
  key[0xfd] = '\0';
  key[0xfe] = '\0';
  key[0xff] = '\0';
  key[0x80] = '\0';
  key[0x81] = '\0';
  key[0x82] = '\0';
  key[0x83] = '\0';
  key[0x84] = '\0';
  key[0x85] = '\0';
  key[0x86] = '\0';
  key[0x87] = '\0';
  key[0x88] = '\0';
  key[0x89] = '\0';
  key[0x8a] = '\0';
  key[0x8b] = '\0';
  key[0x8c] = '\0';
  key[0x8d] = '\0';
  key[0x8e] = '\0';
  key[0x8f] = '\0';
  key[0x90] = '\0';
  key[0x91] = '\0';
  key[0x92] = '\0';
  key[0x93] = '\0';
  key[0x94] = '\0';
  key[0x95] = '\0';
  key[0x96] = '\0';
  key[0x97] = '\0';
  key[0x98] = '\0';
  key[0x99] = '\0';
  key[0x9a] = '\0';
  key[0x9b] = '\0';
  key[0x9c] = '\0';
  key[0x9d] = '\0';
  key[0x9e] = '\0';
  key[0x9f] = '\0';
  key[0xa0] = '\0';
  key[0xa1] = '\0';
  key[0xa2] = '\0';
  key[0xa3] = '\0';
  key[0xa4] = '\0';
  key[0xa5] = '\0';
  key[0xa6] = '\0';
  key[0xa7] = '\0';
  key[0xa8] = '\0';
  key[0xa9] = '\0';
  key[0xaa] = '\0';
  key[0xab] = '\0';
  key[0xac] = '\0';
  key[0xad] = '\0';
  key[0xae] = '\0';
  key[0xaf] = '\0';
  key[0xb0] = '\0';
  key[0xb1] = '\0';
  key[0xb2] = '\0';
  key[0xb3] = '\0';
  key[0xb4] = '\0';
  key[0xb5] = '\0';
  key[0xb6] = '\0';
  key[0xb7] = '\0';
  key[0xb8] = '\0';
  key[0xb9] = '\0';
  key[0xba] = '\0';
  key[0xbb] = '\0';
  key[0xbc] = '\0';
  key[0xbd] = '\0';
  key[0xbe] = '\0';
  key[0xbf] = '\0';
  key[0x40] = '\0';
  key[0x41] = '\0';
  key[0x42] = '\0';
  key[0x43] = '\0';
  key[0x44] = '\0';
  key[0x45] = '\0';
  key[0x46] = '\0';
  key[0x47] = '\0';
  key[0x48] = '\0';
  key[0x49] = '\0';
  key[0x4a] = '\0';
  key[0x4b] = '\0';
  key[0x4c] = '\0';
  key[0x4d] = '\0';
  key[0x4e] = '\0';
  key[0x4f] = '\0';
  key[0x50] = '\0';
  key[0x51] = '\0';
  key[0x52] = '\0';
  key[0x53] = '\0';
  key[0x54] = '\0';
  key[0x55] = '\0';
  key[0x56] = '\0';
  key[0x57] = '\0';
  key[0x58] = '\0';
  key[0x59] = '\0';
  key[0x5a] = '\0';
  key[0x5b] = '\0';
  key[0x5c] = '\0';
  key[0x5d] = '\0';
  key[0x5e] = '\0';
  key[0x5f] = '\0';
  key[0x60] = '\0';
  key[0x61] = '\0';
  key[0x62] = '\0';
  key[99] = '\0';
  key[100] = '\0';
  key[0x65] = '\0';
  key[0x66] = '\0';
  key[0x67] = '\0';
  key[0x68] = '\0';
  key[0x69] = '\0';
  key[0x6a] = '\0';
  key[0x6b] = '\0';
  key[0x6c] = '\0';
  key[0x6d] = '\0';
  key[0x6e] = '\0';
  key[0x6f] = '\0';
  key[0x70] = '\0';
  key[0x71] = '\0';
  key[0x72] = '\0';
  key[0x73] = '\0';
  key[0x74] = '\0';
  key[0x75] = '\0';
  key[0x76] = '\0';
  key[0x77] = '\0';
  key[0x78] = '\0';
  key[0x79] = '\0';
  key[0x7a] = '\0';
  key[0x7b] = '\0';
  key[0x7c] = '\0';
  key[0x7d] = '\0';
  key[0x7e] = '\0';
  key[0x7f] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  key[8] = '\0';
  key[9] = '\0';
  key[10] = '\0';
  key[0xb] = '\0';
  key[0xc] = '\0';
  key[0xd] = '\0';
  key[0xe] = '\0';
  key[0xf] = '\0';
  key[0x10] = '\0';
  key[0x11] = '\0';
  key[0x12] = '\0';
  key[0x13] = '\0';
  key[0x14] = '\0';
  key[0x15] = '\0';
  key[0x16] = '\0';
  key[0x17] = '\0';
  key[0x18] = '\0';
  key[0x19] = '\0';
  key[0x1a] = '\0';
  key[0x1b] = '\0';
  key[0x1c] = '\0';
  key[0x1d] = '\0';
  key[0x1e] = '\0';
  key[0x1f] = '\0';
  key[0x20] = '\0';
  key[0x21] = '\0';
  key[0x22] = '\0';
  key[0x23] = '\0';
  key[0x24] = '\0';
  key[0x25] = '\0';
  key[0x26] = '\0';
  key[0x27] = '\0';
  key[0x28] = '\0';
  key[0x29] = '\0';
  key[0x2a] = '\0';
  key[0x2b] = '\0';
  key[0x2c] = '\0';
  key[0x2d] = '\0';
  key[0x2e] = '\0';
  key[0x2f] = '\0';
  key[0x30] = '\0';
  key[0x31] = '\0';
  key[0x32] = '\0';
  key[0x33] = '\0';
  key[0x34] = '\0';
  key[0x35] = '\0';
  key[0x36] = '\0';
  key[0x37] = '\0';
  key[0x38] = '\0';
  key[0x39] = '\0';
  key[0x3a] = '\0';
  key[0x3b] = '\0';
  key[0x3c] = '\0';
  key[0x3d] = '\0';
  key[0x3e] = '\0';
  key[0x3f] = '\0';
  printf("Testing %i coordinates (L%i) : \n",(ulong)(uVar2 << (Ybits & 0x1fU)),
         CONCAT44(in_register_00000014,inputLen),CONCAT44(in_register_0000000c,step));
  local_150 = (size_t)inputLen;
  for (uVar1 = 0; uVar1 != (~((int)uVar2 >> 0x1f) & uVar2); uVar1 = uVar1 + 1) {
    local_154 = uVar1;
    memcpy(key,&local_154,local_150);
    for (uVar3 = 0; (~((int)uVar4 >> 0x1f) & uVar4) != uVar3; uVar3 = uVar3 + 1) {
      Blob<128>::Blob(&h);
      (*hash)(key,inputLen,uVar3,&h);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back(hashes,&h);
    }
  }
  return;
}

Assistant:

void PerlinNoiseTest (int Xbits, int Ybits,
                      int inputLen, int step,
                      pfHash hash, std::vector<hashtype> & hashes )
{
  assert(0 < Ybits && Ybits < 31);
  assert(0 < Xbits && Xbits < 31);
  assert(inputLen*8 > Xbits);  // enough space to run the test

  int const xMax = (1 << Xbits);
  int const yMax = (1 << Ybits);

  assert(Xbits + Ybits < 31);

#define INPUT_LEN_MAX 256
  assert(inputLen <= INPUT_LEN_MAX);
  char key[INPUT_LEN_MAX] = {0};

  printf("Testing %i coordinates (L%i) : \n", xMax * yMax, inputLen);

  for(int x = 0; x < xMax; x++) {
      memcpy(key, &x, inputLen);  // Note : only works with Little Endian
      for (int y=0; y < yMax; y++) {
          hashtype h;
          hash(key, inputLen, y, &h);
          hashes.push_back(h);
      }
  }
}